

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O1

int do_look(boolean quick)

{
  nh_menuitem *pnVar1;
  obj *poVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint extraout_EAX;
  uint extraout_EAX_00;
  undefined8 extraout_RAX;
  ulong uVar9;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  undefined7 extraout_var;
  boolean in_CL;
  boolean without_asking;
  long lVar10;
  char *pcVar11;
  nh_desc_buf *__src;
  undefined7 in_register_00000039;
  char *pcVar12;
  uint uVar13;
  coord cc;
  menulist menu;
  int selected [1];
  char out_str [256];
  char firstmatch [256];
  nh_desc_buf descbuf;
  coord local_85a;
  menulist local_858;
  boolean local_841;
  uint local_840;
  int local_83c;
  byte local_838 [256];
  char local_738 [260];
  nh_desc_buf local_634;
  
  if (quick == '\0') {
    cVar3 = yn_function("Specify unknown object by cursor?","ynq",'q');
    if (cVar3 == 'q') {
      return (uint)CONCAT71(extraout_var,cVar3);
    }
    if (cVar3 != 'y') {
      getlin("Specify what? (type the word)",(char *)local_838);
      if (local_838[0] == 0) {
        return (uint)local_838[0];
      }
      if (local_838[0] == 0x1b) {
        return (uint)local_838[0];
      }
      checkfile((char *)local_838,(permonst *)0x1,'\x01',in_CL);
      return extraout_EAX_00;
    }
  }
  local_85a.x = u.ux;
  local_85a.y = u.uy;
  local_841 = flags.verbose;
  flags.verbose = flags.verbose != '\0' && quick == '\0';
  pcVar12 = local_634.objdesc;
  local_840 = (uint)CONCAT71(in_register_00000039,quick);
  do {
    local_838[0] = 0;
    if (flags.verbose == '\0') {
      pline("Pick an object.");
    }
    else {
      pline("Please move the cursor to %s.");
    }
    iVar4 = getpos(&local_85a,'\0',"an unknown object");
    if ((iVar4 < 0) || (local_85a.x < '\0')) {
      if (local_841 == '\0') {
        flags.verbose = local_841;
        return local_840;
      }
      pcVar12 = "Never mind.";
      if ((char)local_840 == '\0') {
        pcVar12 = "Done.";
      }
      goto LAB_0020d447;
    }
    flags.verbose = '\0';
    nh_describe_pos((uint)(byte)local_85a.x,(int)local_85a.y,&local_634);
    lVar10 = (long)local_85a.y;
    poVar2 = level->objects[local_85a.x][lVar10];
    uVar13 = 0;
    iVar7 = 0;
    if ((poVar2 != (obj *)0x0) && ((1 < poVar2->quan || (poVar2->oartifact == '\x1d')))) {
      iVar7 = 1;
    }
    init_menulist(&local_858);
    without_asking = (boolean)lVar10;
    local_838[0] = 0;
    iVar5 = append_str((char *)local_838,local_634.effectdesc,0);
    if (iVar5 != 0) {
      lVar10 = (long)local_858.size;
      if (local_858.size <= local_858.icount) {
        local_858.size = local_858.size * 2;
        local_858.items = (nh_menuitem *)realloc(local_858.items,lVar10 * 0x218);
      }
      without_asking = (char)local_858.icount * '\f';
      pnVar1 = local_858.items + local_858.icount;
      pnVar1->id = 0x65;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_634.effectdesc);
      local_858.icount = local_858.icount + 1;
      strcpy(local_738,local_634.effectdesc);
      uVar13 = 1;
    }
    iVar6 = append_str((char *)local_838,local_634.invisdesc,0);
    if (iVar6 != 0) {
      lVar10 = (long)local_858.size;
      if (local_858.size <= local_858.icount) {
        local_858.size = local_858.size * 2;
        local_858.items = (nh_menuitem *)realloc(local_858.items,lVar10 * 0x218);
      }
      without_asking = (char)local_858.icount * '\f';
      pnVar1 = local_858.items + local_858.icount;
      pnVar1->id = 0x69;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_634.invisdesc);
      local_858.icount = local_858.icount + 1;
      uVar13 = 2;
      if (iVar5 == 0) {
        strcpy(local_738,local_634.invisdesc);
        uVar13 = 1;
      }
    }
    pcVar11 = local_634.mondesc;
    iVar5 = append_str((char *)local_838,pcVar11,0);
    if (iVar5 != 0) {
      lVar10 = (long)local_858.size;
      if (local_858.size <= local_858.icount) {
        local_858.size = local_858.size * 2;
        local_858.items = (nh_menuitem *)realloc(local_858.items,lVar10 * 0x218);
      }
      without_asking = (char)local_858.icount * '\f';
      pnVar1 = local_858.items + local_858.icount;
      pnVar1->id = 0x6d;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,pcVar11);
      local_858.icount = local_858.icount + 1;
      if (uVar13 == 0) {
        strcpy(local_738,pcVar11);
        uVar13 = 1;
      }
      else {
        uVar13 = uVar13 + 1;
      }
    }
    iVar7 = append_str((char *)local_838,pcVar12,iVar7);
    if (iVar7 == 0) {
      cVar3 = (char)local_840;
    }
    else {
      lVar10 = (long)local_858.size;
      if (local_858.size <= local_858.icount) {
        local_858.size = local_858.size * 2;
        local_858.items = (nh_menuitem *)realloc(local_858.items,lVar10 * 0x218);
      }
      without_asking = (char)local_858.icount * '\f';
      pnVar1 = local_858.items + local_858.icount;
      pnVar1->id = 0x6f;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,pcVar12);
      local_858.icount = local_858.icount + 1;
      cVar3 = (char)local_840;
      if (uVar13 == 0) {
        strcpy(local_738,pcVar12);
        uVar13 = 1;
      }
      else {
        uVar13 = uVar13 + 1;
      }
    }
    pcVar11 = local_634.trapdesc;
    iVar7 = append_str((char *)local_838,pcVar11,0);
    if (iVar7 != 0) {
      lVar10 = (long)local_858.size;
      if (local_858.size <= local_858.icount) {
        local_858.size = local_858.size * 2;
        local_858.items = (nh_menuitem *)realloc(local_858.items,lVar10 * 0x218);
      }
      without_asking = (char)local_858.icount * '\f';
      pnVar1 = local_858.items + local_858.icount;
      pnVar1->id = 0x74;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,pcVar11);
      local_858.icount = local_858.icount + 1;
      if (uVar13 == 0) {
        strcpy(local_738,pcVar11);
        uVar13 = 1;
      }
      else {
        uVar13 = uVar13 + 1;
      }
    }
    iVar7 = append_str((char *)local_838,local_634.bgdesc,0);
    if ((iVar7 != 0) && (uVar13 == 0)) {
      lVar10 = (long)local_858.size;
      if (local_858.size <= local_858.icount) {
        local_858.size = local_858.size * 2;
        local_858.items = (nh_menuitem *)realloc(local_858.items,lVar10 * 0x218);
      }
      without_asking = (char)local_858.icount * '\f';
      pnVar1 = local_858.items + local_858.icount;
      pnVar1->id = 0x62;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_634.bgdesc);
      local_858.icount = local_858.icount + 1;
      strcpy(local_738,local_634.bgdesc);
      uVar13 = 1;
    }
    if (uVar13 == 0) {
      pline("I\'ve never heard of such things.");
      uVar9 = extraout_RAX_00;
    }
    else {
      local_838[0] = highc(local_838[0]);
      pline("%s.");
      uVar9 = CONCAT71((int7)((ulong)extraout_RAX >> 8),iVar4 != 3);
      if (((cVar3 == '\0' || iVar4 == 3) && (uVar9 = (ulong)(iVar4 - 1U), 1 < iVar4 - 1U)) &&
         (uVar13 != 0)) {
        if (1 < uVar13) {
          without_asking = '\x01';
          uVar8 = display_menu(local_858.items,local_858.icount,"More info?",1,&local_83c);
          uVar9 = (ulong)uVar8;
          if (uVar8 != 1) goto LAB_0020d3c4;
          if (local_83c < 0x6d) {
            if (local_83c == 0x62) {
              __src = &local_634;
            }
            else {
              __src = (nh_desc_buf *)local_634.effectdesc;
              if ((local_83c != 0x65) &&
                 (__src = (nh_desc_buf *)local_634.invisdesc, local_83c != 0x69)) goto LAB_0020d3a0;
            }
          }
          else {
            __src = (nh_desc_buf *)local_634.mondesc;
            if (((local_83c != 0x6d) && (__src = (nh_desc_buf *)pcVar12, local_83c != 0x6f)) &&
               (__src = (nh_desc_buf *)local_634.trapdesc, local_83c != 0x74)) goto LAB_0020d3a0;
          }
          strcpy(local_738,__src->bgdesc);
        }
LAB_0020d3a0:
        checkfile(local_738,(permonst *)(ulong)(1 < uVar13),iVar4 == 3 || 1 < uVar13,without_asking)
        ;
        uVar9 = extraout_RAX_01;
      }
    }
LAB_0020d3c4:
    if (local_858.icount != 0) {
      free(local_858.items);
      uVar9 = extraout_RAX_02;
    }
    if (cVar3 != '\0') {
      check_tutorial_farlook((int)local_85a.x,(int)local_85a.y);
      uVar9 = extraout_RAX_03;
      goto LAB_0020d3fd;
    }
    if (iVar4 == 2) {
LAB_0020d3fd:
      uVar13 = (uint)CONCAT71((int7)(uVar9 >> 8),local_841 != '\0');
      flags.verbose = local_841;
      if (cVar3 == '\0' && local_841 != '\0') {
        pcVar12 = "Done.";
LAB_0020d447:
        flags.verbose = local_841;
        pline(pcVar12);
        uVar13 = extraout_EAX;
      }
      return uVar13;
    }
  } while( true );
}

Assistant:

static int do_look(boolean quick)
{
    char out_str[BUFSZ];
    char firstmatch[BUFSZ];
    int i, ans = 0, objplur = 0;
    int found;		/* count of matching syms found */
    coord cc;		/* screen pos of unknown glyph */
    boolean save_verbose;	/* saved value of flags.verbose */
    boolean from_screen;	/* question from the screen */
    struct nh_desc_buf descbuf;
    struct obj *otmp;
    struct menulist menu;
    int n, selected[1];

    if (quick) {
	from_screen = TRUE;	/* yes, we want to use the cursor */
    } else {
	i = ynq("Specify unknown object by cursor?");
	if (i == 'q') return 0;
	from_screen = (i == 'y');
    }

    if (from_screen) {
	cc.x = u.ux;
	cc.y = u.uy;
    } else {
	getlin("Specify what? (type the word)", out_str);
	if (out_str[0] == '\0' || out_str[0] == '\033')
	    return 0;

	/* the ability to specify symbols is gone: it is simply impossible to
	 * know how the window port is displaying things (tiles?) and even if
	 * charaters are used it may not be possible to type them (utf8)
	 */
	
	checkfile(out_str, NULL, TRUE, TRUE);
	return 0;
    }
    /* Save the verbose flag, we change it later. */
    save_verbose = flags.verbose;
    flags.verbose = flags.verbose && !quick;
    
    /*
     * we're identifying from the screen.
     */
    do {
	/* Reset some variables. */
	found = 0;
	out_str[0] = '\0';
	objplur = 0;

	if (flags.verbose)
	    pline("Please move the cursor to %s.",
		    what_is_an_unknown_object);
	else
	    pline("Pick an object.");

	ans = getpos(&cc, FALSE, what_is_an_unknown_object);
	if (ans < 0 || cc.x < 0) {
	    flags.verbose = save_verbose;
	    if (flags.verbose)
		pline(quick ? "Never mind." : "Done.");
	    return 0;	/* done */
	}
	flags.verbose = FALSE;	/* only print long question once */

	nh_describe_pos(cc.x, cc.y, &descbuf);
	
	otmp = vobj_at(cc.x, cc.y);
	if (otmp && is_plural(otmp))
	    objplur = 1;

	init_menulist(&menu);
	out_str[0] = '\0';
	if (append_str(out_str, descbuf.effectdesc, 0)) {
	    add_menuitem(&menu, 'e', descbuf.effectdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.effectdesc);
	}
	if (append_str(out_str, descbuf.invisdesc, 0)) {
	    add_menuitem(&menu, 'i', descbuf.invisdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.invisdesc);
	}
	if (append_str(out_str, descbuf.mondesc, 0)) {
	    add_menuitem(&menu, 'm', descbuf.mondesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.mondesc);
	}
	if (append_str(out_str, descbuf.objdesc, objplur)) {
	    add_menuitem(&menu, 'o', descbuf.objdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.objdesc);
	}
	if (append_str(out_str, descbuf.trapdesc, 0)) {
	    add_menuitem(&menu, 't', descbuf.trapdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.trapdesc);
	}
	if (append_str(out_str, descbuf.bgdesc, 0)) {
	    if (!found) {
		add_menuitem(&menu, 'b', descbuf.bgdesc, 0, FALSE);
		found++; /* only increment found if nothing else was seen,
		so that checkfile can be called below */
		strcpy (firstmatch, descbuf.bgdesc);
	    }
	}

	/* Finally, print out our explanation. */
	if (found) {
	    out_str[0] = highc(out_str[0]);
	    pline("%s.", out_str);
	    /* check the data file for information about this thing */
	    if (found > 0 && ans != LOOK_QUICK && ans != LOOK_ONCE &&
			(ans == LOOK_VERBOSE || !quick)) {
		if (found > 1) {
		    n = display_menu(menu.items, menu.icount, "More info?",
				     PICK_ONE, selected);
		    if (n == 1) {
			switch (selected[0]) {
			case 'e': strcpy(firstmatch, descbuf.effectdesc); break;
			case 'i': strcpy(firstmatch, descbuf.invisdesc); break;
			case 'm': strcpy(firstmatch, descbuf.mondesc); break;
			case 'o': strcpy(firstmatch, descbuf.objdesc); break;
			case 't': strcpy(firstmatch, descbuf.trapdesc); break;
			case 'b': strcpy(firstmatch, descbuf.bgdesc); break;
			}
		    }
		} else {
		    n = 1;
		}
		if (n == 1) {
		    /* Fake user_typed_name here when choosing from a menu above
		     * so players get feedback for missing database entries. */
		    checkfile(firstmatch, NULL, found > 1,
			      (ans == LOOK_VERBOSE || found > 1));
		}
	    }
	} else {
	    pline("I've never heard of such things.");
	}

	if (menu.icount)
	    free(menu.items);

	if (quick) check_tutorial_farlook(cc.x, cc.y);
    } while (!quick && ans != LOOK_ONCE);

    flags.verbose = save_verbose;
    if (!quick && flags.verbose)
	pline("Done.");

    return 0;
}